

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodegenerator.cpp
# Opt level: O1

void stackjit::ByteCodeGenerator::generateFunction(ostream *stream,Function *function)

{
  pointer pbVar1;
  pointer pcVar2;
  char cVar3;
  Function *this;
  _Alloc_hider _Var4;
  size_type sVar5;
  bool bVar6;
  OpCodes OVar7;
  InstructionFormats IVar8;
  char cVar9;
  int iVar10;
  ostream *poVar11;
  AttributeContainer *attributes;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar12;
  vector<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_> *pvVar13;
  mapped_type *pmVar14;
  string *psVar15;
  Function *function_00;
  long lVar16;
  Function *function_01;
  size_type sVar17;
  char *pcVar18;
  pointer pbVar19;
  pointer this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local;
  float fVar20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> parameter;
  mapped_type opCode;
  string local_98;
  Function *local_78;
  string local_70;
  string local_50;
  
  bVar6 = Loader::Function::isExternal(function);
  if (bVar6) {
    std::__ostream_insert<char,std::char_traits<char>>(stream,"extern ",7);
    Loader::getSignature_abi_cxx11_(&local_70,(Loader *)function,function_00);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        (stream,local_70._M_dataplus._M_p,local_70._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
    Loader::Function::returnType_abi_cxx11_(&local_98,function);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar11,local_98._M_dataplus._M_p,local_98._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
    std::ostream::put((char)poVar11);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
  }
  else {
    bVar6 = Loader::Function::isMemberFunction(function);
    if (bVar6) {
      pcVar18 = "member ";
      lVar16 = 7;
    }
    else {
      pcVar18 = "func ";
      lVar16 = 5;
    }
    std::__ostream_insert<char,std::char_traits<char>>(stream,pcVar18,lVar16);
    Loader::getSignature_abi_cxx11_(&local_70,(Loader *)function,function_01);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        (stream,local_70._M_dataplus._M_p,local_70._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
    Loader::Function::returnType_abi_cxx11_(&local_98,function);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar11,local_98._M_dataplus._M_p,local_98._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
    std::ostream::put((char)poVar11);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    std::__ostream_insert<char,std::char_traits<char>>(stream,"{",1);
    cVar3 = (char)stream;
    std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar3);
    std::ostream::put(cVar3);
    std::ostream::flush();
    attributes = Loader::Function::attributes_abi_cxx11_(function);
    generateAttributes(stream,attributes);
    local_78 = function;
    pvVar12 = Loader::Function::localTypes_abi_cxx11_(function);
    if ((pvVar12->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish !=
        (pvVar12->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start) {
      std::__ostream_insert<char,std::char_traits<char>>(stream,"\t.locals ",9);
      this = local_78;
      Loader::Function::localTypes_abi_cxx11_(local_78);
      poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)stream);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
      std::ostream::put((char)poVar11);
      std::ostream::flush();
      pvVar12 = Loader::Function::localTypes_abi_cxx11_(this);
      pbVar1 = (pvVar12->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar19 = (pvVar12->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start; pbVar19 != pbVar1;
          pbVar19 = pbVar19 + 1) {
        iVar10 = std::__cxx11::string::compare((char *)pbVar19);
        if (iVar10 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>(stream,"\t.local ",8);
          poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)stream);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar11,(pbVar19->_M_dataplus)._M_p,pbVar19->_M_string_length);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
          std::ostream::put((char)poVar11);
          std::ostream::flush();
        }
      }
    }
    pvVar13 = Loader::Function::instructions(local_78);
    this_00 = (pvVar13->
              super__Vector_base<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_>
              )._M_impl.super__Vector_impl_data._M_start;
    local_78 = (Function *)
               (pvVar13->
               super__Vector_base<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    if ((Function *)this_00 != local_78) {
      do {
        OVar7 = Loader::Instruction::opCode(this_00);
        local_98._M_dataplus._M_p._0_1_ = OVar7;
        pmVar14 = std::__detail::
                  _Map_base<unsigned_char,_std::pair<const_unsigned_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_char>,_std::hash<unsigned_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::at((_Map_base<unsigned_char,_std::pair<const_unsigned_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_char>,_std::hash<unsigned_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        *)(anonymous_namespace)::opCodeTable_abi_cxx11_,(key_type *)&local_98);
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        pcVar2 = (pmVar14->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,pcVar2,pcVar2 + pmVar14->_M_string_length);
        sVar5 = local_70._M_string_length;
        _Var4._M_p = local_70._M_dataplus._M_p;
        if (local_70._M_string_length != 0) {
          sVar17 = 0;
          do {
            iVar10 = toupper((int)_Var4._M_p[sVar17]);
            _Var4._M_p[sVar17] = (char)iVar10;
            sVar17 = sVar17 + 1;
          } while (sVar5 != sVar17);
        }
        std::__ostream_insert<char,std::char_traits<char>>(stream,"\t",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (stream,local_70._M_dataplus._M_p,local_70._M_string_length);
        IVar8 = Loader::Instruction::format(this_00);
        switch(IVar8) {
        case IntData:
          std::__ostream_insert<char,std::char_traits<char>>(stream," ",1);
          iVar10 = Loader::Instruction::intValue(this_00);
          goto LAB_0013b5c4;
        case FloatData:
          std::__ostream_insert<char,std::char_traits<char>>(stream," ",1);
          fVar20 = Loader::Instruction::floatValue(this_00);
          std::ostream::_M_insert<double>((double)fVar20);
          break;
        case CharData:
          std::__ostream_insert<char,std::char_traits<char>>(stream," ",1);
          cVar9 = Loader::Instruction::charValue(this_00);
          iVar10 = (int)cVar9;
LAB_0013b5c4:
          std::ostream::operator<<((ostream *)stream,iVar10);
          break;
        case StringData:
          std::__ostream_insert<char,std::char_traits<char>>(stream," ",1);
          psVar15 = Loader::Instruction::stringValue_abi_cxx11_(this_00);
          std::__ostream_insert<char,std::char_traits<char>>
                    (stream,(psVar15->_M_dataplus)._M_p,psVar15->_M_string_length);
          break;
        case StringConstantData:
          std::__ostream_insert<char,std::char_traits<char>>(stream," ",1);
          psVar15 = Loader::Instruction::stringValue_abi_cxx11_(this_00);
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          pcVar2 = (psVar15->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_50,pcVar2,pcVar2 + psVar15->_M_string_length);
          escapedString(&local_98,&local_50);
          std::__ostream_insert<char,std::char_traits<char>>
                    (stream,local_98._M_dataplus._M_p,local_98._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
          break;
        case Call:
          std::__ostream_insert<char,std::char_traits<char>>(stream," ",1);
          psVar15 = Loader::Instruction::stringValue_abi_cxx11_(this_00);
          std::__ostream_insert<char,std::char_traits<char>>
                    (stream,(psVar15->_M_dataplus)._M_p,psVar15->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(stream,"(",1);
          pvVar12 = Loader::Instruction::callParameters_abi_cxx11_(this_00);
          pbVar19 = (pvVar12->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          pbVar1 = (pvVar12->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          if (pbVar19 != pbVar1) {
            bVar6 = true;
            do {
              local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
              pcVar2 = (pbVar19->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_98,pcVar2,pcVar2 + pbVar19->_M_string_length);
              if (bVar6) {
                bVar6 = false;
              }
              else {
                std::__ostream_insert<char,std::char_traits<char>>(stream," ",1);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        (stream,local_98._M_dataplus._M_p,local_98._M_string_length);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_98._M_dataplus._M_p != &local_98.field_2) {
                operator_delete(local_98._M_dataplus._M_p);
              }
              pbVar19 = pbVar19 + 1;
            } while (pbVar19 != pbVar1);
          }
          std::__ostream_insert<char,std::char_traits<char>>(stream,")",1);
          break;
        case CallInstance:
          std::__ostream_insert<char,std::char_traits<char>>(stream," ",1);
          psVar15 = Loader::Instruction::calledClassType_abi_cxx11_(this_00);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              (stream,(psVar15->_M_dataplus)._M_p,psVar15->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,"::",2);
          psVar15 = Loader::Instruction::stringValue_abi_cxx11_(this_00);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar11,(psVar15->_M_dataplus)._M_p,psVar15->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(stream,"(",1);
          pvVar12 = Loader::Instruction::callParameters_abi_cxx11_(this_00);
          pbVar19 = (pvVar12->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          pbVar1 = (pvVar12->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          if (pbVar19 != pbVar1) {
            bVar6 = true;
            do {
              local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
              pcVar2 = (pbVar19->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_98,pcVar2,pcVar2 + pbVar19->_M_string_length);
              if (bVar6) {
                bVar6 = false;
              }
              else {
                std::__ostream_insert<char,std::char_traits<char>>(stream," ",1);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        (stream,local_98._M_dataplus._M_p,local_98._M_string_length);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_98._M_dataplus._M_p != &local_98.field_2) {
                operator_delete(local_98._M_dataplus._M_p);
              }
              pbVar19 = pbVar19 + 1;
            } while (pbVar19 != pbVar1);
          }
          std::__ostream_insert<char,std::char_traits<char>>(stream,")",1);
        }
        std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar3);
        std::ostream::put(cVar3);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
        this_00 = this_00 + 1;
      } while ((Function *)this_00 != local_78);
    }
    std::__ostream_insert<char,std::char_traits<char>>(stream,"}",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar3);
    std::ostream::put(cVar3);
    std::ostream::flush();
  }
  return;
}

Assistant:

void ByteCodeGenerator::generateFunction(std::ostream& stream, const Loader::Function& function) {
		if (function.isExternal()) {
			stream << "extern " << Loader::getSignature(function) << " " << function.returnType() << std::endl;
		} else {
			if (function.isMemberFunction()) {
				stream << "member ";
			} else {
				stream << "func ";
			}

			stream << Loader::getSignature(function) << " " << function.returnType() << std::endl;

			stream << "{" << std::endl;

			ByteCodeGenerator::generateAttributes(stream, function.attributes());

			if (function.localTypes().size() > 0) {
				stream << "\t.locals " << function.localTypes().size() << std::endl;

				std::size_t i = 0;
				for (auto& local : function.localTypes()) {
					if (local != "") {
						stream << "\t.local " << i << " " << local << std::endl;
					}
					i++;
				}
			}

			for (auto& inst : function.instructions()) {
				auto opCode = opCodeTable.at((unsigned char)inst.opCode());
				std::transform(opCode.begin(), opCode.end(), opCode.begin(), ::toupper);
				stream << "\t" << opCode;

				switch (inst.format()) {
					case Loader::InstructionFormats::OpCodeOnly:
						break;
					case Loader::InstructionFormats::IntData:
						stream << " " << inst.intValue();
						break;
					case Loader::InstructionFormats::FloatData:
						stream << " " << inst.floatValue();
						break;
					case Loader::InstructionFormats::CharData:
						stream << " " << (int)inst.charValue();
						break;
					case Loader::InstructionFormats::StringData:
						stream << " " << inst.stringValue();
						break;
					case Loader::InstructionFormats::StringConstantData:
						stream << " " << escapedString(inst.stringValue());
						break;
					case Loader::InstructionFormats::Call: {
						stream << " " << inst.stringValue();
						stream << "(";
						bool isFirst = true;

						for (auto parameter : inst.callParameters()) {
							if (!isFirst) {
								stream << " ";
							} else {
								isFirst = false;
							}

							stream << parameter;
						}

						stream << ")";
						break;
					}
					case Loader::InstructionFormats::CallInstance: {
						stream << " " << inst.calledClassType() << "::" << inst.stringValue();
						stream << "(";
						bool isFirst = true;

						for (auto parameter : inst.callParameters()) {
							if (!isFirst) {
								stream << " ";
							} else {
								isFirst = false;
							}

							stream << parameter;
						}

						stream << ")";
						break;
					}
				}

				stream << std::endl;
			}

			stream << "}" << std::endl;
		}
	}